

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckBuilder.cpp
# Opt level: O0

void __thiscall
DeckBuilder::deckShuffler(DeckBuilder *this,list<BlackCard_*,_std::allocator<BlackCard_*>_> *black)

{
  bool bVar1;
  reference __x;
  iterator __first;
  reference __x_00;
  __normal_iterator<BlackCard_**,_std::vector<BlackCard_*,_std::allocator<BlackCard_*>_>_> local_88;
  BlackCard **local_80;
  __normal_iterator<BlackCard_**,_std::vector<BlackCard_*,_std::allocator<BlackCard_*>_>_> local_78;
  iterator it2;
  _Self local_48;
  _List_node_base *local_40;
  _List_iterator<BlackCard_*> local_38;
  iterator it;
  vector<BlackCard_*,_std::allocator<BlackCard_*>_> vect;
  list<BlackCard_*,_std::allocator<BlackCard_*>_> *black_local;
  DeckBuilder *this_local;
  
  std::vector<BlackCard_*,_std::allocator<BlackCard_*>_>::vector
            ((vector<BlackCard_*,_std::allocator<BlackCard_*>_> *)&it);
  std::_List_iterator<BlackCard_*>::_List_iterator(&local_38);
  local_40 = (_List_node_base *)
             std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::begin(black);
  local_38._M_node = local_40;
  while( true ) {
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::end(black);
    bVar1 = std::operator!=(&local_38,&local_48);
    if (!bVar1) break;
    __x = std::_List_iterator<BlackCard_*>::operator*(&local_38);
    std::vector<BlackCard_*,_std::allocator<BlackCard_*>_>::push_back
              ((vector<BlackCard_*,_std::allocator<BlackCard_*>_> *)&it,__x);
    std::_List_iterator<BlackCard_*>::operator++(&local_38,0);
  }
  __first = std::vector<BlackCard_*,_std::allocator<BlackCard_*>_>::begin
                      ((vector<BlackCard_*,_std::allocator<BlackCard_*>_> *)&it);
  it2 = std::vector<BlackCard_*,_std::allocator<BlackCard_*>_>::end
                  ((vector<BlackCard_*,_std::allocator<BlackCard_*>_> *)&it);
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<BlackCard**,std::vector<BlackCard*,std::allocator<BlackCard*>>>>
            ((__normal_iterator<BlackCard_**,_std::vector<BlackCard_*,_std::allocator<BlackCard_*>_>_>
              )__first._M_current,
             (__normal_iterator<BlackCard_**,_std::vector<BlackCard_*,_std::allocator<BlackCard_*>_>_>
              )it2._M_current);
  std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::clear(black);
  __gnu_cxx::
  __normal_iterator<BlackCard_**,_std::vector<BlackCard_*,_std::allocator<BlackCard_*>_>_>::
  __normal_iterator(&local_78);
  local_80 = (BlackCard **)
             std::vector<BlackCard_*,_std::allocator<BlackCard_*>_>::begin
                       ((vector<BlackCard_*,_std::allocator<BlackCard_*>_> *)&it);
  local_78._M_current = local_80;
  while( true ) {
    local_88._M_current =
         (BlackCard **)
         std::vector<BlackCard_*,_std::allocator<BlackCard_*>_>::end
                   ((vector<BlackCard_*,_std::allocator<BlackCard_*>_> *)&it);
    bVar1 = __gnu_cxx::operator!=(&local_78,&local_88);
    if (!bVar1) break;
    __x_00 = __gnu_cxx::
             __normal_iterator<BlackCard_**,_std::vector<BlackCard_*,_std::allocator<BlackCard_*>_>_>
             ::operator*(&local_78);
    std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::push_back(black,__x_00);
    __gnu_cxx::
    __normal_iterator<BlackCard_**,_std::vector<BlackCard_*,_std::allocator<BlackCard_*>_>_>::
    operator++(&local_78,0);
  }
  std::vector<BlackCard_*,_std::allocator<BlackCard_*>_>::~vector
            ((vector<BlackCard_*,_std::allocator<BlackCard_*>_> *)&it);
  return;
}

Assistant:

void DeckBuilder::deckShuffler(list<BlackCard *> *black)
{
	vector<BlackCard *> vect;
	list<BlackCard *>::iterator it;
	for (it = black->begin(); it != black->end(); it++)
		vect.push_back((*it));

	random_shuffle(vect.begin(), vect.end());

	black->clear();

	vector<BlackCard *>::iterator it2;
	for (it2 = vect.begin(); it2 != vect.end(); it2++)
		black->push_back((*it2));
}